

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
tinyusdz::lerp<tinyusdz::value::color4d>
          (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *b,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer pcVar7;
  pointer pcVar8;
  pointer pcVar9;
  ulong uVar10;
  long lVar11;
  ulong __new_size;
  double dVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (long)(a->
                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar10 <= __new_size) {
    __new_size = uVar10;
  }
  if (__new_size != 0) {
    std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::resize
              (__return_storage_ptr__,__new_size);
    pcVar7 = (a->
             super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar8 = (b->
             super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar7 ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar8) {
      dVar12 = 1.0 - t;
      pcVar9 = (__return_storage_ptr__->
               super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0x18;
      do {
        dVar1 = *(double *)((long)pcVar7 + lVar11 + -0x10);
        dVar2 = *(double *)((long)pcVar7 + lVar11 + -8);
        dVar3 = *(double *)((long)&pcVar7->r + lVar11);
        dVar4 = *(double *)((long)pcVar8 + lVar11 + -0x10);
        dVar5 = *(double *)((long)pcVar8 + lVar11 + -8);
        dVar6 = *(double *)((long)&pcVar8->r + lVar11);
        *(double *)((long)pcVar9 + lVar11 + -0x18) =
             *(double *)((long)pcVar8 + lVar11 + -0x18) * t +
             *(double *)((long)pcVar7 + lVar11 + -0x18) * dVar12;
        *(double *)((long)pcVar9 + lVar11 + -0x10) = dVar4 * t + dVar1 * dVar12;
        *(double *)((long)pcVar9 + lVar11 + -8) = dVar5 * t + dVar2 * dVar12;
        *(double *)((long)&pcVar9->r + lVar11) = dVar6 * t + dVar3 * dVar12;
        lVar11 = lVar11 + 0x20;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}